

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O1

Char * Diligent::GetFilterTypeLiteralName(FILTER_TYPE FilterType,bool bGetFullName)

{
  char *pcVar1;
  char *pcVar2;
  undefined7 in_register_00000039;
  char (*in_R8) [2];
  string msg;
  uint local_2c;
  string local_28;
  
  switch(CONCAT71(in_register_00000039,FilterType) & 0xffffffff) {
  case 0:
    pcVar2 = "FILTER_TYPE_UNKNOWN";
    pcVar1 = "unknown";
    break;
  case 1:
    pcVar2 = "FILTER_TYPE_POINT";
    pcVar1 = "point";
    break;
  case 2:
    pcVar2 = "FILTER_TYPE_LINEAR";
    pcVar1 = "linear";
    break;
  case 3:
    pcVar2 = "FILTER_TYPE_ANISOTROPIC";
    pcVar1 = "anisotropic";
    break;
  case 4:
    pcVar2 = "FILTER_TYPE_COMPARISON_POINT";
    pcVar1 = "comparison point";
    break;
  case 5:
    pcVar2 = "FILTER_TYPE_COMPARISON_LINEAR";
    pcVar1 = "comparison linear";
    break;
  case 6:
    pcVar2 = "FILTER_TYPE_COMPARISON_ANISOTROPIC";
    pcVar1 = "comparison anisotropic";
    break;
  case 7:
    pcVar2 = "FILTER_TYPE_MINIMUM_POINT";
    pcVar1 = "minimum point";
    break;
  case 8:
    pcVar2 = "FILTER_TYPE_MINIMUM_LINEAR";
    pcVar1 = "minimum linear";
    break;
  case 9:
    pcVar2 = "FILTER_TYPE_MINIMUM_ANISOTROPIC";
    pcVar1 = "minimum anisotropic";
    break;
  case 10:
    pcVar2 = "FILTER_TYPE_MAXIMUM_POINT";
    pcVar1 = "maximum point";
    break;
  case 0xb:
    pcVar2 = "FILTER_TYPE_MAXIMUM_LINEAR";
    pcVar1 = "maximum linear";
    break;
  case 0xc:
    pcVar2 = "FILTER_TYPE_MAXIMUM_ANISOTROPIC";
    pcVar1 = "maximum anisotropic";
    break;
  default:
    local_2c = (uint)FilterType;
    FormatString<char[25],unsigned_int,char[2]>
              (&local_28,(Diligent *)"Unexpected filter type (",(char (*) [25])&local_2c,
               (uint *)0x33e49a,in_R8);
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"GetFilterTypeLiteralName",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x38a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    return "UNKNOWN";
  }
  if (bGetFullName) {
    pcVar1 = pcVar2;
  }
  return pcVar1;
}

Assistant:

const Char* GetFilterTypeLiteralName(FILTER_TYPE FilterType, bool bGetFullName)
{
    static_assert(FILTER_TYPE_NUM_FILTERS == 13, "Please update the switch below to handle the new filter type");
    switch (FilterType)
    {
        // clang-format off
        case FILTER_TYPE_UNKNOWN:                return bGetFullName ? "FILTER_TYPE_UNKNOWN"                : "unknown";
        case FILTER_TYPE_POINT:                  return bGetFullName ? "FILTER_TYPE_POINT"                  : "point";
        case FILTER_TYPE_LINEAR:                 return bGetFullName ? "FILTER_TYPE_LINEAR"                 : "linear";
        case FILTER_TYPE_ANISOTROPIC:            return bGetFullName ? "FILTER_TYPE_ANISOTROPIC"            : "anisotropic";
        case FILTER_TYPE_COMPARISON_POINT:       return bGetFullName ? "FILTER_TYPE_COMPARISON_POINT"       : "comparison point";
        case FILTER_TYPE_COMPARISON_LINEAR:      return bGetFullName ? "FILTER_TYPE_COMPARISON_LINEAR"      : "comparison linear";
        case FILTER_TYPE_COMPARISON_ANISOTROPIC: return bGetFullName ? "FILTER_TYPE_COMPARISON_ANISOTROPIC" : "comparison anisotropic";
        case FILTER_TYPE_MINIMUM_POINT:          return bGetFullName ? "FILTER_TYPE_MINIMUM_POINT"          : "minimum point";
        case FILTER_TYPE_MINIMUM_LINEAR:         return bGetFullName ? "FILTER_TYPE_MINIMUM_LINEAR"         : "minimum linear";
        case FILTER_TYPE_MINIMUM_ANISOTROPIC:    return bGetFullName ? "FILTER_TYPE_MINIMUM_ANISOTROPIC"    : "minimum anisotropic";
        case FILTER_TYPE_MAXIMUM_POINT:          return bGetFullName ? "FILTER_TYPE_MAXIMUM_POINT"          : "maximum point";
        case FILTER_TYPE_MAXIMUM_LINEAR:         return bGetFullName ? "FILTER_TYPE_MAXIMUM_LINEAR"         : "maximum linear";
        case FILTER_TYPE_MAXIMUM_ANISOTROPIC:    return bGetFullName ? "FILTER_TYPE_MAXIMUM_ANISOTROPIC"    : "maximum anisotropic";
        // clang-format on
        default:
            UNEXPECTED("Unexpected filter type (", Uint32{FilterType}, ")");
            return "UNKNOWN";
    }
}